

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O2

void __thiscall VcprojGenerator::initConfiguration(VcprojGenerator *this)

{
  QString *pQVar1;
  long lVar2;
  QMakeProject *pQVar3;
  qsizetype qVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  Data *pDVar7;
  QStringBuilder<const_char_(&)[2],_ProString> *pQVar8;
  Data *pDVar9;
  SourceFiles *pSVar10;
  SourceFiles *pSVar11;
  QString file;
  bool bVar12;
  char cVar13;
  char cVar14;
  short sVar15;
  DotNET DVar16;
  ConfigurationTypes CVar17;
  triState tVar18;
  charSet cVar19;
  ProStringList *this_00;
  char *pcVar20;
  long in_FS_OFFSET;
  undefined1 in_stack_fffffffffffffec8 [15];
  char in_stack_fffffffffffffed8;
  char cVar21;
  undefined7 in_stack_fffffffffffffed9;
  undefined7 uVar22;
  QStringBuilder<const_char_(&)[2],_ProString> *pQStack_120;
  qsizetype local_118;
  QStringBuilder<const_char_(&)[2],_ProString> local_f8;
  QArrayDataPointer<char16_t> local_b8;
  QFileInfo targetInfo;
  ProString local_98;
  ProString temp;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  QString::QString((QString *)&local_f8,"suppress_vcproj_warnings");
  bVar12 = QMakeProject::isActiveConfig(pQVar3,(QString *)&local_f8,false);
  (this->vcProject).Configuration.suppressUnknownOptionWarnings = bVar12;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
  pQVar3 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)&temp,"MSVC_VER");
  QMakeEvaluator::first((ProString *)&local_f8,&pQVar3->super_QMakeEvaluator,(ProKey *)&temp);
  DVar16 = vsVersionFromString((ProString *)&local_f8);
  (this->vcProject).Configuration.CompilerVersion = DVar16;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&temp);
  initCompilerTool(this);
  pQVar3 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  QString::QString((QString *)&local_f8,"debug");
  cVar13 = QMakeProject::isActiveConfig(pQVar3,(QString *)&local_f8,false);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
  if (this->projectTarget == StaticLib) {
    initLibrarianTool(this);
  }
  else {
    pQVar3 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    QString::QString((QString *)&local_f8,"debug_info");
    bVar12 = QMakeProject::isActiveConfig(pQVar3,(QString *)&local_f8,false);
    (this->vcProject).Configuration.linker.GenerateDebugInformation = (uint)bVar12;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
    initLinkerTool(this);
  }
  initManifestTool(this);
  initResourceTool(this);
  temp.m_file = -0x55555556;
  temp._36_4_ = 0xaaaaaaaa;
  temp.m_hash = 0xaaaaaaaaaaaaaaaa;
  temp.m_string.d.size = -0x5555555555555556;
  temp.m_offset = -0x55555556;
  temp.m_length = -0x55555556;
  temp.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  temp.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  pQVar3 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)&local_f8,"BuildBrowserInformation");
  QMakeEvaluator::first(&temp,&pQVar3->super_QMakeEvaluator,(ProKey *)&local_f8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
  CVar17 = typeDynamicLibrary;
  if (this->projectTarget != SharedLib) {
    CVar17 = (uint)(this->projectTarget == StaticLib) * 3 + typeApplication;
  }
  (this->vcProject).Configuration.ConfigurationType = CVar17;
  pQVar3 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)&local_98,"DESTDIR");
  QMakeEvaluator::first((ProString *)&local_f8,&pQVar3->super_QMakeEvaluator,(ProKey *)&local_98);
  ProString::toQString((QString *)&stack0xfffffffffffffed8,(ProString *)&local_f8);
  pQVar1 = &(this->vcProject).Configuration.OutputDirectory;
  pDVar7 = (this->vcProject).Configuration.OutputDirectory.d.d;
  pQVar8 = (QStringBuilder<const_char_(&)[2],_ProString> *)
           (this->vcProject).Configuration.OutputDirectory.d.ptr;
  (this->vcProject).Configuration.OutputDirectory.d.d =
       (Data *)CONCAT71(in_stack_fffffffffffffed9,in_stack_fffffffffffffed8);
  (this->vcProject).Configuration.OutputDirectory.d.ptr = (char16_t *)pQStack_120;
  cVar21 = (char)pDVar7;
  uVar22 = (undefined7)((ulong)pDVar7 >> 8);
  qVar4 = (this->vcProject).Configuration.OutputDirectory.d.size;
  (this->vcProject).Configuration.OutputDirectory.d.size = local_118;
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)&stack0xfffffffffffffed8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
  if ((this->vcProject).Configuration.OutputDirectory.d.size == 0) {
    QString::operator=(pQVar1,".\\");
  }
  QString::QString((QString *)&local_f8,"\\");
  cVar14 = QString::endsWith((QString *)pQVar1,(CaseSensitivity)&local_f8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
  if (cVar14 == '\0') {
    QString::append((QChar)(char16_t)pQVar1);
  }
  pQStack_120 = pQVar8;
  if (0x9f < (int)(this->vcProject).Configuration.CompilerVersion) {
    retrievePlatformToolSet((QString *)&local_f8,this);
    pDVar7 = (this->vcProject).Configuration.PlatformToolSet.d.d;
    pDVar9 = (Data *)(this->vcProject).Configuration.PlatformToolSet.d.ptr;
    (this->vcProject).Configuration.PlatformToolSet.d.d = (Data *)local_f8.a;
    (this->vcProject).Configuration.PlatformToolSet.d.ptr = (char16_t *)local_f8.b.m_string.d.d;
    pcVar5 = (char16_t *)(this->vcProject).Configuration.PlatformToolSet.d.size;
    (this->vcProject).Configuration.PlatformToolSet.d.size = (qsizetype)local_f8.b.m_string.d.ptr;
    local_f8.a = (char (*) [2])pDVar7;
    local_f8.b.m_string.d.d = pDVar9;
    local_f8.b.m_string.d.ptr = pcVar5;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
    _targetInfo = (_func_int **)0xaaaaaaaaaaaaaaaa;
    pQVar3 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey((ProKey *)&local_98,"MSVCPROJ_TARGET");
    QMakeEvaluator::first((ProString *)&local_f8,&pQVar3->super_QMakeEvaluator,(ProKey *)&local_98);
    ProString::toQString((QString *)&local_b8,(ProString *)&local_f8);
    file.d.ptr._7_1_ = cVar13;
    file.d._0_15_ = in_stack_fffffffffffffec8;
    file.d.size._0_1_ = cVar21;
    file.d.size._1_7_ = uVar22;
    MakefileGenerator::fileInfo((MakefileGenerator *)&targetInfo,file);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
    QFileInfo::completeBaseName();
    pDVar7 = (this->vcProject).Configuration.PrimaryOutput.d.d;
    pDVar9 = (Data *)(this->vcProject).Configuration.PrimaryOutput.d.ptr;
    (this->vcProject).Configuration.PrimaryOutput.d.d = (Data *)local_f8.a;
    (this->vcProject).Configuration.PrimaryOutput.d.ptr = (char16_t *)local_f8.b.m_string.d.d;
    pcVar5 = (char16_t *)(this->vcProject).Configuration.PrimaryOutput.d.size;
    (this->vcProject).Configuration.PrimaryOutput.d.size = (qsizetype)local_f8.b.m_string.d.ptr;
    local_f8.a = (char (*) [2])pDVar7;
    local_f8.b.m_string.d.d = pDVar9;
    local_f8.b.m_string.d.ptr = pcVar5;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
    local_f8.b.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_f8.a = (char (*) [2])0xaaaaaaaaaaaaaaaa;
    local_f8.b.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    QFileInfo::suffix();
    bVar12 = isStandardSuffix(this,(QString *)&local_f8);
    if (!bVar12) {
      cVar21 = '.';
      QStringBuilder<char,_const_QString_&>::convertTo<QString>
                (&local_98.m_string,
                 (QStringBuilder<char,_const_QString_&> *)&stack0xfffffffffffffed8);
      pSVar10 = (SourceFiles *)(this->vcProject).Configuration.PrimaryOutputExtension.d.d;
      pSVar11 = (SourceFiles *)(this->vcProject).Configuration.PrimaryOutputExtension.d.ptr;
      (this->vcProject).Configuration.PrimaryOutputExtension.d.d = local_98.m_string.d.d;
      (this->vcProject).Configuration.PrimaryOutputExtension.d.ptr = local_98.m_string.d.ptr;
      qVar6 = (this->vcProject).Configuration.PrimaryOutputExtension.d.size;
      (this->vcProject).Configuration.PrimaryOutputExtension.d.size = local_98.m_string.d.size;
      local_98.m_string.d.d = (Data *)pSVar10;
      local_98.m_string.d.ptr = (char16_t *)pSVar11;
      local_98.m_string.d.size = qVar6;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
      pQStack_120 = &local_f8;
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
    QFileInfo::~QFileInfo(&targetInfo);
  }
  pQVar3 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)&local_f8,"BUILD_NAME");
  this_00 = QMakeEvaluator::valuesRef(&pQVar3->super_QMakeEvaluator,(ProKey *)&local_f8);
  ProStringList::join(&local_98.m_string,this_00,(QChar)0x20);
  pQVar1 = &(this->vcProject).Configuration.Name;
  pSVar10 = (SourceFiles *)(this->vcProject).Configuration.Name.d.d;
  pSVar11 = (SourceFiles *)(this->vcProject).Configuration.Name.d.ptr;
  (this->vcProject).Configuration.Name.d.d = local_98.m_string.d.d;
  (this->vcProject).Configuration.Name.d.ptr = local_98.m_string.d.ptr;
  qVar6 = (this->vcProject).Configuration.Name.d.size;
  (this->vcProject).Configuration.Name.d.size = local_98.m_string.d.size;
  local_98.m_string.d.d = (Data *)pSVar10;
  local_98.m_string.d.ptr = (char16_t *)pSVar11;
  local_98.m_string.d.size = qVar6;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
  if ((this->vcProject).Configuration.Name.d.size == 0) {
    pcVar20 = "Release";
    if (cVar13 != '\0') {
      pcVar20 = "Debug";
    }
    QString::operator=(pQVar1,pcVar20);
  }
  QString::operator=(&(this->vcProject).Configuration.ConfigurationName,(QString *)pQVar1);
  pQVar3 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)&local_f8,"VCPROJ_ARCH");
  bVar12 = QMakeProject::isEmpty(pQVar3,(ProKey *)&local_f8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
  if (bVar12) {
    pcVar20 = "|Win32";
    if (this->is64Bit != false) {
      pcVar20 = "|x64";
    }
    QString::operator+=(pQVar1,pcVar20);
  }
  else {
    pQVar3 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey((ProKey *)&stack0xfffffffffffffed8,"VCPROJ_ARCH");
    QMakeEvaluator::first
              (&local_98,&pQVar3->super_QMakeEvaluator,(ProKey *)&stack0xfffffffffffffed8);
    local_f8.a = (char (*) [2])0x21a2c9;
    ProString::ProString(&local_f8.b,&local_98);
    ::operator+=(pQVar1,&local_f8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8.b);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)&stack0xfffffffffffffed8);
  }
  pQVar3 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)&local_98,"ATLMinimizesCRunTimeLibraryUsage");
  QMakeEvaluator::first((ProString *)&local_f8,&pQVar3->super_QMakeEvaluator,(ProKey *)&local_98);
  (this->vcProject).Configuration.ATLMinimizesCRunTimeLibraryUsage =
       (uint)(local_f8.b.m_string.d.size._4_4_ != 0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
  if (temp.m_length == 0) {
    tVar18 = unset;
  }
  else {
    sVar15 = ProString::toShort(&temp,(bool *)0x0,10);
    tVar18 = (triState)sVar15;
  }
  (this->vcProject).Configuration.BuildBrowserInformation = tVar18;
  pQVar3 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)&local_98,"CharacterSet");
  QMakeEvaluator::first((ProString *)&local_f8,&pQVar3->super_QMakeEvaluator,(ProKey *)&local_98);
  ProString::operator=(&temp,(ProString *)&local_f8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
  if (temp.m_length == 0) {
    cVar19 = charSetNotSet;
  }
  else {
    sVar15 = ProString::toShort(&temp,(bool *)0x0,10);
    cVar19 = (charSet)sVar15;
  }
  (this->vcProject).Configuration.CharacterSet = cVar19;
  pQVar3 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)&local_98,"DeleteExtensionsOnClean");
  QMakeEvaluator::first((ProString *)&local_f8,&pQVar3->super_QMakeEvaluator,(ProKey *)&local_98);
  ProString::toQString((QString *)&stack0xfffffffffffffed8,(ProString *)&local_f8);
  pDVar7 = (this->vcProject).Configuration.DeleteExtensionsOnClean.d.d;
  pcVar5 = (this->vcProject).Configuration.DeleteExtensionsOnClean.d.ptr;
  (this->vcProject).Configuration.DeleteExtensionsOnClean.d.d = (Data *)CONCAT71(uVar22,cVar21);
  (this->vcProject).Configuration.DeleteExtensionsOnClean.d.ptr = (char16_t *)pQStack_120;
  cVar13 = (char)pDVar7;
  uVar22 = (undefined7)((ulong)pDVar7 >> 8);
  qVar6 = (this->vcProject).Configuration.DeleteExtensionsOnClean.d.size;
  (this->vcProject).Configuration.DeleteExtensionsOnClean.d.size = qVar4;
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)&stack0xfffffffffffffed8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
  QString::operator=(&(this->vcProject).Configuration.ImportLibrary,
                     (QString *)&(this->vcProject).Configuration.linker.ImportLibrary);
  pQVar3 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)&local_98,"OBJECTS_DIR");
  QMakeEvaluator::first((ProString *)&local_f8,&pQVar3->super_QMakeEvaluator,(ProKey *)&local_98);
  ProString::toQString((QString *)&stack0xfffffffffffffed8,(ProString *)&local_f8);
  (this->vcProject).Configuration.IntermediateDirectory.d.d = (Data *)CONCAT71(uVar22,cVar13);
  (this->vcProject).Configuration.IntermediateDirectory.d.ptr = pcVar5;
  (this->vcProject).Configuration.IntermediateDirectory.d.size = qVar6;
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)&stack0xfffffffffffffed8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
  (this->vcProject).Configuration.WholeProgramOptimization =
       (this->vcProject).Configuration.compiler.WholeProgramOptimization;
  pQVar3 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)&local_98,"UseOfATL");
  QMakeEvaluator::first((ProString *)&local_f8,&pQVar3->super_QMakeEvaluator,(ProKey *)&local_98);
  ProString::operator=(&temp,(ProString *)&local_f8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
  if (temp.m_length != 0) {
    sVar15 = ProString::toShort(&temp,(bool *)0x0,10);
    (this->vcProject).Configuration.UseOfATL = (int)sVar15;
  }
  pQVar3 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)&local_98,"UseOfMfc");
  QMakeEvaluator::first((ProString *)&local_f8,&pQVar3->super_QMakeEvaluator,(ProKey *)&local_98);
  ProString::operator=(&temp,(ProString *)&local_f8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
  if (temp.m_length != 0) {
    sVar15 = ProString::toShort(&temp,(bool *)0x0,10);
    (this->vcProject).Configuration.UseOfMfc = (int)sVar15;
  }
  initPostBuildEventTools(this);
  if ((((this->super_Win32MakefileGenerator).super_MakefileGenerator.project)->super_QMakeEvaluator)
      .m_hostBuild == false) {
    initDeploymentTool(this);
  }
  initWinDeployQtTool(this);
  initPreLinkEventTools(this);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&temp);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void VcprojGenerator::initConfiguration()
{
    // Initialize XML sub elements
    // - Do this first since main configuration elements may need
    // - to know of certain compiler/linker options
    VCConfiguration &conf = vcProject.Configuration;
    conf.suppressUnknownOptionWarnings = project->isActiveConfig("suppress_vcproj_warnings");
    conf.CompilerVersion = vsVersionFromString(project->first("MSVC_VER"));

    initCompilerTool();

    // Only on configuration per build
    bool isDebug = project->isActiveConfig("debug");

    if(projectTarget == StaticLib)
        initLibrarianTool();
    else {
        conf.linker.GenerateDebugInformation = project->isActiveConfig("debug_info") ? _True : _False;
        initLinkerTool();
    }
    initManifestTool();
    initResourceTool();
    initIDLTool();

    // Own elements -----------------------------
    ProString temp = project->first("BuildBrowserInformation");
    switch (projectTarget) {
    case SharedLib:
        conf.ConfigurationType = typeDynamicLibrary;
        break;
    case StaticLib:
        conf.ConfigurationType = typeStaticLibrary;
        break;
    case Application:
    default:
        conf.ConfigurationType = typeApplication;
        break;
    }

    conf.OutputDirectory = project->first("DESTDIR").toQString();
    if (conf.OutputDirectory.isEmpty())
        conf.OutputDirectory = ".\\";
    if (!conf.OutputDirectory.endsWith("\\"))
        conf.OutputDirectory += '\\';
    if (conf.CompilerVersion >= NET2010) {
        conf.PlatformToolSet = retrievePlatformToolSet();

        const QFileInfo targetInfo = fileInfo(project->first("MSVCPROJ_TARGET").toQString());
        conf.PrimaryOutput = targetInfo.completeBaseName();

        const QString targetSuffix = targetInfo.suffix();
        if (!isStandardSuffix(targetSuffix))
            conf.PrimaryOutputExtension = '.' + targetSuffix;
    }

    conf.Name = project->values("BUILD_NAME").join(' ');
    if (conf.Name.isEmpty())
        conf.Name = isDebug ? "Debug" : "Release";
    conf.ConfigurationName = conf.Name;
    if (!project->isEmpty("VCPROJ_ARCH")) {
        conf.Name += "|" + project->first("VCPROJ_ARCH");
    } else {
        conf.Name += (is64Bit ? "|x64" : "|Win32");
    }
    conf.ATLMinimizesCRunTimeLibraryUsage = (project->first("ATLMinimizesCRunTimeLibraryUsage").isEmpty() ? _False : _True);
    conf.BuildBrowserInformation = triState(temp.isEmpty() ? (short)unset : temp.toShort());
    temp = project->first("CharacterSet");
    conf.CharacterSet = charSet(temp.isEmpty() ? short(charSetNotSet) : temp.toShort());
    conf.DeleteExtensionsOnClean = project->first("DeleteExtensionsOnClean").toQString();
    conf.ImportLibrary = conf.linker.ImportLibrary;
    conf.IntermediateDirectory = project->first("OBJECTS_DIR").toQString();
    conf.WholeProgramOptimization = conf.compiler.WholeProgramOptimization;
    temp = project->first("UseOfATL");
    if(!temp.isEmpty())
        conf.UseOfATL = useOfATL(temp.toShort());
    temp = project->first("UseOfMfc");
    if(!temp.isEmpty())
        conf.UseOfMfc = useOfMfc(temp.toShort());

    // Configuration does not need parameters from
    // these sub XML items;
    initCustomBuildTool();
    initPreBuildEventTools();
    initPostBuildEventTools();
    // Only deploy for crosscompiled projects
    if (!project->isHostBuild())
        initDeploymentTool();
    initWinDeployQtTool();
    initPreLinkEventTools();
}